

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

_Bool FileExists(char *fileName)

{
  int iVar1;
  _Bool result;
  char *fileName_local;
  
  iVar1 = access(fileName,0);
  return iVar1 != -1;
}

Assistant:

bool FileExists(const char *fileName)
{
    bool result = false;

#if defined(_WIN32)
    if (_access(fileName, 0) != -1) result = true;
#else
    if (access(fileName, F_OK) != -1) result = true;
#endif

    return result;
}